

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O0

CURLcode easysrc_perform(void)

{
  curl_slist *local_18;
  curl_slist *ptr;
  int i;
  CURLcode ret;
  
  ptr._4_4_ = CURLE_OK;
  if (easysrc_toohard != (slist_wc *)0x0) {
    ptr._4_4_ = easysrc_add(&easysrc_code,"");
    ptr._0_4_ = 0;
    while (srchard[(int)ptr] != (char *)0x0 && ptr._4_4_ == CURLE_OK) {
      ptr._4_4_ = easysrc_add(&easysrc_code,srchard[(int)ptr]);
      ptr._0_4_ = (int)ptr + 1;
    }
    if ((easysrc_toohard != (slist_wc *)0x0) && (ptr._4_4_ == CURLE_OK)) {
      for (local_18 = easysrc_toohard->first; local_18 != (curl_slist *)0x0 && ptr._4_4_ == CURLE_OK
          ; local_18 = local_18->next) {
        ptr._4_4_ = easysrc_add(&easysrc_code,local_18->data);
      }
    }
    if (ptr._4_4_ == CURLE_OK) {
      ptr._4_4_ = easysrc_add(&easysrc_code,"");
    }
    if (ptr._4_4_ == CURLE_OK) {
      ptr._4_4_ = easysrc_add(&easysrc_code,"*/");
    }
    slist_wc_free_all(easysrc_toohard);
    easysrc_toohard = (slist_wc *)0x0;
  }
  if (ptr._4_4_ == CURLE_OK) {
    ptr._4_4_ = easysrc_add(&easysrc_code,"");
  }
  if (ptr._4_4_ == CURLE_OK) {
    ptr._4_4_ = easysrc_add(&easysrc_code,"ret = curl_easy_perform(hnd);");
  }
  if (ptr._4_4_ == CURLE_OK) {
    ptr._4_4_ = easysrc_add(&easysrc_code,"");
  }
  return ptr._4_4_;
}

Assistant:

CURLcode easysrc_perform(void)
{
  CURLcode ret = CURLE_OK;
  /* Note any setopt calls which we could not convert */
  if(easysrc_toohard) {
    int i;
    struct curl_slist *ptr;
    ret = easysrc_add(&easysrc_code, "");
    /* Preamble comment */
    for(i = 0; srchard[i] && !ret; i++)
      ret = easysrc_add(&easysrc_code, srchard[i]);
    /* Each unconverted option */
    if(easysrc_toohard && !ret) {
      for(ptr = easysrc_toohard->first; ptr && !ret; ptr = ptr->next)
        ret = easysrc_add(&easysrc_code, ptr->data);
    }
    if(!ret)
      ret = easysrc_add(&easysrc_code, "");
    if(!ret)
      ret = easysrc_add(&easysrc_code, "*/");

    slist_wc_free_all(easysrc_toohard);
    easysrc_toohard = NULL;
  }

  if(!ret)
    ret = easysrc_add(&easysrc_code, "");
  if(!ret)
    ret = easysrc_add(&easysrc_code, "ret = curl_easy_perform(hnd);");
  if(!ret)
    ret = easysrc_add(&easysrc_code, "");

  return ret;
}